

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  double *pdVar19;
  double **ppdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  int *piVar26;
  double *pdVar27;
  double *pdVar28;
  double *pdVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int j;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  double *pdVar37;
  double *pdVar38;
  int k;
  ulong uVar39;
  double __x;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double sumOverJD1;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  pdVar19 = this->gPartials[parIndex];
  ppdVar20 = this->gTransitionMatrices;
  pdVar21 = ppdVar20[probIndex];
  pdVar22 = ppdVar20[firstDerivativeIndex];
  pdVar23 = ppdVar20[secondDerivativeIndex];
  pdVar24 = this->gStateFrequencies[stateFrequenciesIndex];
  pdVar25 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar26 = this->gTipStates[childIndex], piVar26 != (int *)0x0)) {
    uVar14 = this->kPatternCount;
    uVar15 = this->kCategoryCount;
    lVar35 = 0;
    for (uVar34 = 0; uVar34 != (~((int)uVar15 >> 0x1f) & uVar15); uVar34 = uVar34 + 1) {
      uVar16 = this->kStateCount;
      iVar17 = this->kPartialsPaddedStateCount;
      lVar35 = (long)(int)lVar35;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = pdVar25[uVar34];
      pdVar37 = pdVar19 + lVar35;
      iVar18 = this->kMatrixSize;
      lVar31 = 0;
      for (uVar39 = 0; uVar39 != (~((int)uVar14 >> 0x1f) & uVar14); uVar39 = uVar39 + 1) {
        lVar31 = (long)(int)lVar31;
        pdVar38 = this->integrationTmp;
        pdVar27 = this->firstDerivTmp;
        iVar32 = this->kTransPaddedStateCount;
        pdVar28 = this->secondDerivTmp;
        lVar33 = (long)piVar26[uVar39] + (long)(iVar18 * (int)uVar34);
        for (uVar36 = 0; (~((int)uVar16 >> 0x1f) & uVar16) != uVar36; uVar36 = uVar36 + 1) {
          auVar59._8_8_ = 0;
          auVar59._0_8_ = pdVar38[lVar31 + uVar36];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = pdVar21[lVar33] * pdVar37[uVar36];
          auVar59 = vfmadd213sd_fma(auVar47,auVar41,auVar59);
          pdVar38[lVar31 + uVar36] = auVar59._0_8_;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = pdVar27[lVar31 + uVar36];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = pdVar22[lVar33] * pdVar37[uVar36];
          auVar59 = vfmadd213sd_fma(auVar48,auVar41,auVar50);
          pdVar27[lVar31 + uVar36] = auVar59._0_8_;
          pdVar29 = pdVar23 + lVar33;
          lVar33 = lVar33 + iVar32;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar28[lVar31 + uVar36];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *pdVar29 * pdVar37[uVar36];
          auVar59 = vfmadd213sd_fma(auVar49,auVar41,auVar1);
          pdVar28[lVar31 + uVar36] = auVar59._0_8_;
        }
        pdVar37 = pdVar37 + iVar17;
        lVar35 = lVar35 + iVar17;
        lVar31 = lVar31 + uVar36;
      }
    }
  }
  else {
    lVar35 = 0;
    pdVar37 = this->gPartials[childIndex];
    uVar14 = this->kCategoryCount;
    uVar15 = this->kPatternCount;
    for (uVar34 = 0; uVar34 != (~((int)uVar14 >> 0x1f) & uVar14); uVar34 = uVar34 + 1) {
      iVar17 = this->kPartialsPaddedStateCount;
      lVar35 = (long)(int)lVar35;
      uVar16 = this->kStateCount;
      lVar31 = 0;
      pdVar38 = pdVar37 + lVar35;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = pdVar25[uVar34];
      iVar18 = this->kMatrixSize;
      for (uVar30 = 0; uVar30 != (~((int)uVar15 >> 0x1f) & uVar15); uVar30 = uVar30 + 1) {
        pdVar27 = this->integrationTmp;
        pdVar28 = this->firstDerivTmp;
        pdVar29 = this->secondDerivTmp;
        lVar31 = (long)(int)lVar31;
        uVar39 = 0;
        iVar32 = iVar18 * (int)uVar34;
        while (uVar39 != (~((int)uVar16 >> 0x1f) & uVar16)) {
          auVar41 = ZEXT816(0) << 0x40;
          auVar59 = ZEXT816(0) << 0x40;
          auVar50 = ZEXT816(0) << 0x40;
          for (uVar36 = 0; uVar16 != uVar36; uVar36 = uVar36 + 1) {
            auVar60._8_8_ = 0;
            auVar60._0_8_ = pdVar38[uVar36];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pdVar21[(long)iVar32 + uVar36];
            auVar41 = vfmadd231sd_fma(auVar41,auVar60,auVar2);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar22[(long)iVar32 + uVar36];
            auVar59 = vfmadd231sd_fma(auVar59,auVar60,auVar3);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar23[(long)iVar32 + uVar36];
            auVar50 = vfmadd231sd_fma(auVar50,auVar60,auVar4);
          }
          iVar32 = iVar32 + uVar16 + 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pdVar27[lVar31];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = auVar41._0_8_ * pdVar19[lVar35 + uVar39];
          auVar41 = vfmadd213sd_fma(auVar57,auVar42,auVar5);
          pdVar27[lVar31] = auVar41._0_8_;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pdVar28[lVar31];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auVar59._0_8_ * pdVar19[lVar35 + uVar39];
          auVar41 = vfmadd213sd_fma(auVar58,auVar42,auVar6);
          pdVar28[lVar31] = auVar41._0_8_;
          lVar33 = lVar35 + uVar39;
          uVar39 = uVar39 + 1;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar29[lVar31];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = auVar50._0_8_ * pdVar19[lVar33];
          auVar41 = vfmadd213sd_fma(auVar51,auVar42,auVar7);
          pdVar29[lVar31] = auVar41._0_8_;
          lVar31 = lVar31 + 1;
        }
        pdVar38 = pdVar38 + iVar17;
        lVar35 = lVar35 + iVar17;
      }
    }
  }
  lVar35 = 0;
  for (lVar31 = 0; uVar14 = this->kPatternCount, lVar31 < (int)uVar14; lVar31 = lVar31 + 1) {
    lVar35 = (long)(int)lVar35;
    auVar41 = ZEXT816(0) << 0x40;
    auVar59 = ZEXT816(0) << 0x40;
    auVar50 = ZEXT816(0) << 0x40;
    uVar34 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar39 = 0; uVar34 != uVar39; uVar39 = uVar39 + 1) {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = pdVar24[uVar39];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = this->integrationTmp[lVar35 + uVar39];
      auVar41 = vfmadd231sd_fma(auVar41,auVar52,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = this->firstDerivTmp[lVar35 + uVar39];
      auVar59 = vfmadd231sd_fma(auVar59,auVar52,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->secondDerivTmp[lVar35 + uVar39];
      auVar50 = vfmadd231sd_fma(auVar50,auVar52,auVar10);
    }
    lVar35 = lVar35 + uVar34;
    __x = auVar41._0_8_;
    dVar40 = log(__x);
    this->outLogLikelihoodsTmp[lVar31] = dVar40;
    auVar43._0_8_ = auVar59._0_8_ / __x;
    auVar43._8_8_ = 0;
    auVar53._0_8_ = auVar50._0_8_ / __x;
    auVar53._8_8_ = 0;
    this->outFirstDerivativesTmp[lVar31] = auVar43._0_8_;
    auVar41 = vfnmadd231sd_fma(auVar53,auVar43,auVar43);
    this->outSecondDerivativesTmp[lVar31] = auVar41._0_8_;
  }
  if (scalingFactorsIndex == -1) {
    uVar34 = (ulong)(~((int)uVar14 >> 0x1f) & uVar14);
  }
  else {
    pdVar19 = this->outLogLikelihoodsTmp;
    pdVar21 = this->gScaleBuffers[scalingFactorsIndex];
    uVar34 = (ulong)(~((int)uVar14 >> 0x1f) & uVar14);
    for (uVar39 = 0; uVar34 != uVar39; uVar39 = uVar39 + 1) {
      pdVar19[uVar39] = pdVar21[uVar39] + pdVar19[uVar39];
    }
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  uVar39 = 0;
  pdVar19 = this->gPatternWeights;
  pdVar21 = this->outLogLikelihoodsTmp;
  pdVar22 = this->outFirstDerivativesTmp;
  pdVar23 = this->outSecondDerivativesTmp;
  while (uVar34 != uVar39) {
    auVar44._8_8_ = 0;
    auVar44._0_8_ = pdVar21[uVar39];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = pdVar19[uVar39];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *outSumLogLikelihood;
    auVar41 = vfmadd213sd_fma(auVar54,auVar44,auVar11);
    *outSumLogLikelihood = auVar41._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = pdVar22[uVar39];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = pdVar19[uVar39];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *outSumFirstDerivative;
    auVar41 = vfmadd213sd_fma(auVar55,auVar45,auVar12);
    *outSumFirstDerivative = auVar41._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = pdVar23[uVar39];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = pdVar19[uVar39];
    uVar39 = uVar39 + 1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *outSumSecondDerivative;
    auVar41 = vfmadd213sd_fma(auVar56,auVar46,auVar13);
    *outSumSecondDerivative = auVar41._0_8_;
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}